

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

IFStmt * new_if_stmt(void *expr,void *block,void *els)

{
  void *any;
  IFStmt *pIVar1;
  TreeNode *pTVar2;
  IFStmt *stmt;
  void *els_local;
  void *block_local;
  void *expr_local;
  
  any = malloc(0x28);
  pIVar1 = (IFStmt *)require_not_null(any,"Failed to allocate space");
  pTVar2 = new_tree_node((Token *)0x0,if_eval);
  (pIVar1->node).eval = pTVar2->eval;
  (pIVar1->node).token = pTVar2->token;
  pIVar1->expr = expr;
  pIVar1->block = block;
  pIVar1->els = els;
  return pIVar1;
}

Assistant:

IFStmt* new_if_stmt(void* expr, void* block, void* els){
    IFStmt* stmt = new(IFStmt);
    stmt->node = tree_node_(NULL, eval_handler(if_eval));
    stmt->expr = expr;
    stmt->block = block;
    stmt->els = els;
    return stmt;
}